

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask28_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar9 [64];
  
  auVar3 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  auVar7 = vpmovsxbd_avx512f(_DAT_001a2e50);
  uVar2 = *(ulong *)(in + 0x11);
  auVar18._8_8_ = 0x1800000014;
  auVar18._0_8_ = 0x1800000014;
  auVar13 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 1),auVar3);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(in + 5);
  auVar8 = vinserti32x4_avx512f(ZEXT1664(*(undefined1 (*) [16])(in + 1)),auVar16,1);
  auVar20 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 9),auVar3);
  auVar3 = vpshufd_avx(auVar16,0x50);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(in + 0xd);
  auVar16 = vpsrlvd_avx2(auVar19,auVar18);
  auVar9 = vpbroadcastd_avx512f(ZEXT416(in[7]));
  auVar10._0_24_ = auVar8._0_24_;
  auVar10._24_4_ = auVar9._24_4_;
  auVar10._28_4_ = auVar8._28_4_;
  auVar10._32_4_ = auVar8._32_4_;
  auVar10._36_4_ = auVar8._36_4_;
  auVar10._40_4_ = auVar8._40_4_;
  auVar10._44_4_ = auVar8._44_4_;
  auVar10._48_4_ = auVar8._48_4_;
  auVar10._52_4_ = auVar8._52_4_;
  auVar10._56_4_ = auVar8._56_4_;
  auVar10._60_4_ = auVar8._60_4_;
  auVar4 = valignd_avx512vl(ZEXT1632(auVar13),ZEXT1632(auVar13),7);
  auVar7 = vpermi2d_avx512f(auVar7,auVar10,ZEXT1664(*(undefined1 (*) [16])(in + 9)));
  auVar8 = vpmovsxbd_avx512f(_DAT_001a2890);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar7 = vpermi2d_avx512f(auVar8,auVar7,ZEXT864(*(ulong *)(in + 0xd)));
  auVar8 = vpbroadcastd_avx512f(ZEXT416(in[0xf]));
  auVar11._0_52_ = auVar7._0_52_;
  auVar11._52_4_ = auVar8._52_4_;
  auVar11._56_4_ = auVar7._56_4_;
  auVar11._60_4_ = auVar7._60_4_;
  auVar7 = vpermi2q_avx512f(auVar9,auVar11,ZEXT864(uVar2));
  auVar7 = vpsllvd_avx512f(auVar7,_DAT_001b1a40);
  auVar4 = vpblendd_avx2(auVar4,ZEXT432(*in),1);
  auVar13 = vpshufd_avx(auVar18,0x50);
  auVar3 = vpsrlvd_avx2(auVar3,auVar13);
  uVar1 = in[0x17];
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar6._16_4_ = uVar1;
  auVar6._20_4_ = uVar1;
  auVar6._24_4_ = uVar1;
  auVar6._28_4_ = uVar1;
  auVar5._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar20;
  auVar5._16_16_ = ZEXT116(1) * auVar3;
  auVar4 = vpblendd_avx2(auVar4,auVar5,0x60);
  auVar8 = vpbroadcastd_avx512f(ZEXT416(in[8]));
  auVar8 = vinserti32x4_avx512f(ZEXT3264(CONCAT428(auVar8._28_4_,auVar4._0_28_)),auVar20,2);
  auVar8 = vinserti32x4_avx512f(auVar8,auVar16,3);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(in + 0x19);
  auVar3 = vpsrlvd_avx2(auVar13,_DAT_001a2e10);
  auVar9 = vpbroadcastd_avx512f(ZEXT416(in[0x10]));
  auVar12._56_4_ = auVar9._56_4_;
  auVar13 = vpshufd_avx(auVar13,0x50);
  auVar15._0_8_ = auVar3._0_8_;
  auVar15._8_8_ = auVar15._0_8_;
  auVar15._16_8_ = auVar15._0_8_;
  auVar15._24_8_ = auVar15._0_8_;
  auVar9 = vpbroadcastd_avx512f();
  auVar12._0_56_ = auVar8._0_56_;
  auVar12._60_4_ = auVar9._60_4_;
  auVar7 = vpord_avx512f(auVar7,auVar12);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x2010005));
  auVar7 = vmovdqu64_avx512f(auVar7);
  *(undefined1 (*) [64])out = auVar7;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar3 = vpermi2d_avx512vl(auVar3,*(undefined1 (*) [16])(in + 0x13),auVar20);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a2e00);
  auVar4 = vpblendd_avx2(ZEXT1632(*(undefined1 (*) [16])(in + 0x13)),auVar6,0x10);
  auVar5 = vpbroadcastd_avx512vl();
  auVar14._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar4._0_16_;
  auVar14._16_16_ = ZEXT116(0) * auVar4._16_16_ + ZEXT116(1) * auVar13;
  auVar4 = vpblendd_avx2(auVar4,auVar14,0x60);
  auVar6 = vpbroadcastd_avx512vl();
  auVar4 = vpblendd_avx2(auVar4,auVar6,0x80);
  auVar14 = vpsllvd_avx2(auVar4,_DAT_0019f3e0);
  auVar4 = vpblendd_avx2(ZEXT1632(auVar3),auVar5,0x10);
  uVar1 = in[0x18];
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  auVar4 = vpblendd_avx2(auVar4,auVar17,0x20);
  auVar4 = vpblendd_avx2(auVar4,auVar15,0xc0);
  auVar4 = vpor_avx2(auVar14,auVar4);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x2010004));
  *(undefined1 (*) [32])(out + 0x10) = auVar4;
  auVar3 = vpermi2d_avx512vl(auVar3,*(undefined1 (*) [16])(in + 0x1c),auVar6._0_16_);
  auVar13 = vpsrlvd_avx2(auVar3,_DAT_001a2e20);
  auVar3 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 0x1c),_DAT_001a2e30);
  auVar3 = vpor_avx(auVar3,auVar13);
  *(undefined1 (*) [16])(out + 0x18) = auVar3;
  return out + 0x1c;
}

Assistant:

uint32_t *__fastpackwithoutmask28_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;

  return out;
}